

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key,char **value)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  undefined1 local_88 [35];
  allocator local_65;
  int type_local;
  ByteData key_data;
  ByteData data;
  
  type_local = type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_88,"PsbtHandle",(allocator *)&key_data);
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  bVar1 = cfd::capi::IsEmptyString(key);
  if (bVar1) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x8f1;
    local_88._16_8_ = "CfdGetPsbtRecord";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_88,"key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_88,"Failed to parameter. key is null or empty.",
               (allocator *)&key_data);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (value != (char **)0x0) {
    if (*(long *)((long)psbt_handle + 0x18) == 0) {
      local_88._0_8_ = "cfdcapi_psbt.cpp";
      local_88._8_4_ = 0x8fd;
      local_88._16_8_ = "CfdGetPsbtRecord";
      cfd::core::logger::warn<>((CfdSourceLocation *)local_88,"psbt is null.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_88,"Failed to handle statement. psbt is null.",
                 (allocator *)&key_data);
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_88);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)local_88,key,(allocator *)&data);
    cfd::core::ByteData::ByteData(&key_data,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    cfd::core::ByteData::ByteData(&data);
    if (type == 1) {
      cfd::core::Psbt::GetGlobalRecord
                ((ByteData *)local_88,*(Psbt **)((long)psbt_handle + 0x18),&key_data);
    }
    else if (type == 2) {
      cfd::core::Psbt::GetTxInRecord
                ((ByteData *)local_88,*(Psbt **)((long)psbt_handle + 0x18),index,&key_data);
    }
    else {
      if (type != 3) {
        local_88._0_8_ = "cfdcapi_psbt.cpp";
        local_88._8_4_ = 0x910;
        local_88._16_8_ = "CfdGetPsbtRecord";
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)local_88,"type is invalid: {}",&type_local);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_88,"Failed to parameter. type is invalid.",&local_65);
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::Psbt::GetTxOutRecord
                ((ByteData *)local_88,*(Psbt **)((long)psbt_handle + 0x18),index,&key_data);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,local_88);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_88,&data);
    pcVar2 = cfd::capi::CreateString((string *)local_88);
    *value = pcVar2;
    std::__cxx11::string::~string((string *)local_88);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
    return 0;
  }
  local_88._0_8_ = "cfdcapi_psbt.cpp";
  local_88._8_4_ = 0x8f7;
  local_88._16_8_ = "CfdGetPsbtRecord";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_88,"value is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_88,"Failed to parameter. value is null.",(allocator *)&key_data);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index, const char* key,
    char** value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    ByteData data;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        data = psbt_obj->psbt->GetGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        data = psbt_obj->psbt->GetTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        data = psbt_obj->psbt->GetTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    *value = CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}